

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

void anon_unknown.dwarf_23eecfe::sha512::Initialize(uint64_t *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *s = 0x6a09e667f3bcc908;
  s[1] = 0xbb67ae8584caa73b;
  s[2] = 0x3c6ef372fe94f82b;
  s[3] = 0xa54ff53a5f1d36f1;
  s[4] = 0x510e527fade682d1;
  s[5] = 0x9b05688c2b3e6c1f;
  s[6] = 0x1f83d9abfb41bd6b;
  s[7] = 0x5be0cd19137e2179;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void inline Initialize(uint64_t* s)
{
    s[0] = 0x6a09e667f3bcc908ull;
    s[1] = 0xbb67ae8584caa73bull;
    s[2] = 0x3c6ef372fe94f82bull;
    s[3] = 0xa54ff53a5f1d36f1ull;
    s[4] = 0x510e527fade682d1ull;
    s[5] = 0x9b05688c2b3e6c1full;
    s[6] = 0x1f83d9abfb41bd6bull;
    s[7] = 0x5be0cd19137e2179ull;
}